

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerseusNonStationaryQPlanner.cpp
# Opt level: O1

void __thiscall PerseusNonStationaryQPlanner::PlanAll(PerseusNonStationaryQPlanner *this)

{
  _func_int *p_Var1;
  long *plVar2;
  long lVar3;
  pointer pcVar4;
  bool bVar5;
  pointer pdVar6;
  pointer pdVar7;
  ulong uVar8;
  JointBeliefInterface *pJVar9;
  ostream *poVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  PlanningUnitMADPDiscrete *this_00;
  uint uVar14;
  double dVar15;
  QFunctionsDiscreteNonStationary Q;
  QFunctionsDiscrete Qt1;
  undefined1 local_108 [32];
  QFunctionsDiscrete local_e8;
  vector<double,_std::allocator<double>_> local_c8;
  vector<double,_std::allocator<double>_> local_a8;
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  local_88;
  vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
  local_70;
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  local_58;
  long local_38;
  
  Perseus::PlanLeadIn((Perseus *)this);
  p_Var1 = (this->super_PerseusNonStationary).super_Perseus._vptr_Perseus[-3];
  lVar13 = *(long *)((long)&(this->super_PerseusNonStationary).super_Perseus._m_verbose +
                    (long)p_Var1);
  if (lVar13 == 0) {
    lVar13 = *(long *)((long)&(this->super_PerseusNonStationary).super_Perseus._m_bestValue +
                      (long)p_Var1);
  }
  std::
  vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
  ::vector(&local_70,*(size_type *)(lVar13 + 0x18),(allocator_type *)local_108);
  local_e8.
  super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8.
  super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.
  super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.
  super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  plVar2 = *(long **)&(this->super_PerseusNonStationary).super_Perseus.field_0xa8;
  p_Var1 = (this->super_PerseusNonStationary).super_Perseus._vptr_Perseus[-3];
  lVar13 = *(long *)((long)&(this->super_PerseusNonStationary).super_Perseus._m_verbose +
                    (long)p_Var1);
  if (lVar13 == 0) {
    lVar13 = *(long *)((long)&(this->super_PerseusNonStationary).super_Perseus._m_bestValue +
                      (long)p_Var1);
  }
  uVar8 = (ulong)*(uint *)(lVar13 + 0x18);
  lVar13 = *plVar2;
  uVar11 = (plVar2[1] - lVar13 >> 3) * -0x5555555555555555;
  if (uVar11 < uVar8 || uVar11 - uVar8 == 0) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  }
  BeliefValue::GetValues
            ((vector<double,_std::allocator<double>_> *)local_108,
             (BeliefSet *)(lVar13 + uVar8 * 0x18),&local_e8);
  pdVar7 = local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  pdVar6 = local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)local_108._16_8_;
  local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_108._0_8_;
  local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)local_108._8_8_;
  local_108._0_16_ = ZEXT816(0) << 0x20;
  local_108._16_8_ = (pointer)0x0;
  if (pdVar6 != (pointer)0x0) {
    operator_delete(pdVar6,(long)pdVar7 - (long)pdVar6);
  }
  if ((pointer)local_108._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_108._0_8_,local_108._16_8_ - local_108._0_8_);
  }
  p_Var1 = (this->super_PerseusNonStationary).super_Perseus._vptr_Perseus[-3];
  lVar13 = *(long *)((long)&(this->super_PerseusNonStationary).super_Perseus._m_verbose +
                    (long)p_Var1);
  if (lVar13 == 0) {
    lVar13 = *(long *)((long)&(this->super_PerseusNonStationary).super_Perseus._m_bestValue +
                      (long)p_Var1);
  }
  uVar14 = (uint)*(undefined8 *)(lVar13 + 0x18);
  if (-1 < (int)uVar14) {
    uVar11 = (ulong)(uVar14 & 0x7fffffff);
    lVar13 = uVar11 * 0x18;
    lVar12 = 0;
    do {
      Perseus::
      PlanStartOfIteration<std::vector<std::vector<AlphaVector,std::allocator<AlphaVector>>,std::allocator<std::vector<AlphaVector,std::allocator<AlphaVector>>>>>
                ((Perseus *)this,(int)uVar11,&local_c8,&local_e8);
      if (lVar12 == 0) {
        Perseus::GetInitialQFunctions(&local_88,(Perseus *)this);
        local_108._16_8_ =
             local_e8.
             super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_108._8_8_ =
             local_e8.
             super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_108._0_8_ =
             local_e8.
             super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_e8.
        super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_88.
             super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_e8.
        super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_88.
             super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_e8.
        super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_88.
             super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_88.
        super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_88.
        super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_88.
        super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
        ::~vector((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                   *)local_108);
        std::
        vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
        ::~vector(&local_88);
      }
      else {
        plVar2 = *(long **)&(this->super_PerseusNonStationary).super_Perseus.field_0xa8;
        lVar3 = *plVar2;
        uVar8 = (plVar2[1] - lVar3 >> 3) * -0x5555555555555555;
        if (uVar8 < uVar11 || uVar8 - uVar11 == 0) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar11,uVar8);
        }
        local_38 = lVar12;
        (*(this->super_PerseusNonStationary).super_Perseus._vptr_Perseus[0xe])
                  (&local_88,this,lVar3 + lVar13,&local_58);
        local_108._16_8_ =
             local_e8.
             super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_108._8_8_ =
             local_e8.
             super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_108._0_8_ =
             local_e8.
             super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_e8.
        super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_88.
             super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_e8.
        super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_88.
             super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_e8.
        super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_88.
             super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_88.
        super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_88.
        super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_88.
        super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
        ::~vector((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                   *)local_108);
        std::
        vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
        ::~vector(&local_88);
        plVar2 = *(long **)&(this->super_PerseusNonStationary).super_Perseus.field_0xa8;
        lVar12 = *plVar2;
        uVar8 = (plVar2[1] - lVar12 >> 3) * -0x5555555555555555;
        if (uVar8 < uVar11 || uVar8 - uVar11 == 0) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar11);
        }
        BeliefValue::GetValues
                  ((vector<double,_std::allocator<double>_> *)local_108,
                   (BeliefSet *)(lVar12 + lVar13),&local_e8);
        lVar12 = local_38;
        pdVar7 = local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        pdVar6 = local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage = (pointer)local_108._16_8_;
        local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)local_108._0_8_;
        local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = (pointer)local_108._8_8_;
        local_108._0_16_ = ZEXT816(0) << 0x20;
        local_108._16_8_ = (pointer)0x0;
        if ((pointer)pdVar6 != (pointer)0x0) {
          operator_delete(pdVar6,(long)pdVar7 - (long)pdVar6);
        }
        if ((pointer)local_108._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_108._0_8_,local_108._16_8_ - local_108._0_8_);
        }
        std::vector<double,_std::allocator<double>_>::operator=(&local_c8,&local_a8);
        uVar8 = ((long)local_70.
                       super__Vector_base<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_70.
                       super__Vector_base<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        if (uVar8 < uVar11 || uVar8 - uVar11 == 0) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar11);
        }
        std::
        vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
        ::operator=((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                     *)((long)&((local_70.
                                 super__Vector_base<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start + lVar13),&local_e8);
      }
      std::
      vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
      ::operator=(&local_58,&local_e8);
      Perseus::PlanEndOfIteration((Perseus *)this);
      lVar12 = lVar12 + 1;
      lVar13 = lVar13 + -0x18;
      bVar5 = 0 < (long)uVar11;
      uVar11 = uVar11 - 1;
    } while (bVar5);
  }
  (*(this->super_PerseusNonStationary).super_Perseus._vptr_Perseus[4])(this,&local_70);
  if ((this->super_PerseusNonStationary).super_Perseus._m_dryrun == false) {
    (*(this->super_PerseusNonStationary).super_Perseus._vptr_Perseus[7])
              (this,&(this->super_PerseusNonStationary).super_Perseus._m_valueFunctionFilename);
  }
  p_Var1 = (this->super_PerseusNonStationary).super_Perseus._vptr_Perseus[-3];
  this_00 = *(PlanningUnitMADPDiscrete **)
             ((long)&(this->super_PerseusNonStationary).super_Perseus._m_verbose + (long)p_Var1);
  if (this_00 == (PlanningUnitMADPDiscrete *)0x0) {
    this_00 = *(PlanningUnitMADPDiscrete **)
               ((long)&(this->super_PerseusNonStationary).super_Perseus._m_bestValue + (long)p_Var1)
    ;
  }
  pJVar9 = PlanningUnitMADPDiscrete::GetNewJointBeliefFromISD(this_00);
  pcVar4 = (this->super_PerseusNonStationary).super_Perseus._m_identification._M_dataplus._M_p;
  local_108._0_8_ = (pointer)(local_108 + 0x10);
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_108,pcVar4,
             pcVar4 + (this->super_PerseusNonStationary).super_Perseus._m_identification.
                      _M_string_length);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,(char *)local_108._0_8_,local_108._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,": final Vjb0 = ",0xf);
  if (local_70.
      super__Vector_base<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_70.
      super__Vector_base<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    dVar15 = BeliefValue::GetValue
                       ((BeliefInterface *)(&pJVar9->field_0x0 + *(long *)((long)*pJVar9 + -0xb8)),
                        local_70.
                        super__Vector_base<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
    poVar10 = std::ostream::_M_insert<double>(dVar15);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    if ((pointer)local_108._0_8_ != (pointer)(local_108 + 0x10)) {
      operator_delete((void *)local_108._0_8_,
                      (ulong)((long)&(((_Vector_base<AlphaVector,_std::allocator<AlphaVector>_> *)
                                      local_108._16_8_)->_M_impl).super__Vector_impl_data._M_start +
                             1));
    }
    (**(code **)((long)*pJVar9 + 8))(pJVar9);
    Perseus::PlanLeadOut((Perseus *)this);
    if ((pointer)local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((pointer)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::
    vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
    ::~vector(&local_58);
    std::
    vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
    ::~vector(&local_e8);
    std::
    vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
    ::~vector(&local_70);
    return;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
}

Assistant:

void PerseusNonStationaryQPlanner::PlanAll()
{
    PlanLeadIn();

    QFunctionsDiscreteNonStationary Q(GetPU()->GetHorizon());
    QFunctionsDiscrete Qt,Qt1;
    // records the value of each belief in the belief set
    vector<double> VB,VBnew;
    
    VB=BeliefValue::GetValues(_m_beliefs->Get(GetPU()->GetHorizon()),Qt);

    int lastTimestep=GetPU()->GetHorizon();
    for(int t=lastTimestep;t>=0;--t)
    {
        // print out some info
        PlanStartOfIteration(t,VB,Qt);

        // the real thing: compute the next stage value function
        if(t==lastTimestep)
            Qt=GetInitialQFunctions();
        else
        {
            Qt=BackupStageAll(_m_beliefs->Get(t),Qt1);

            // compute the maximum difference in the values for all
            // beliefs: for the convergence test
            VBnew=BeliefValue::GetValues(_m_beliefs->Get(t),Qt);
            
            VB=VBnew;
            Q.at(t)=Qt;
        }

        Qt1=Qt;
        PlanEndOfIteration();
    }

    StoreValueFunction(Q);
    if(!_m_dryrun)
        ExportValueFunction(_m_valueFunctionFilename);
            
    JointBeliefInterface* jb0 = GetPU()->GetNewJointBeliefFromISD();
    cout << GetIdentification() << ": final Vjb0 = "
         << BeliefValue::GetValue( *jb0, Q.at(0)) <<  endl;
    delete jb0;

    PlanLeadOut();
}